

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::LinearSegmentParameter::Encode(LinearSegmentParameter *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8SegNum);
  KDataStream::Write(stream,(this->m_ModificationUnion).m_ui8Modifications);
  (*(this->m_ObjApr).super_ObjectAppearance.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_ObjApr,stream);
  (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Loc,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Length);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Width);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Height);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Depth);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding);
  return;
}

Assistant:

void LinearSegmentParameter::Encode( KDataStream & stream ) const
{
    stream << m_ui8SegNum
           << m_ModificationUnion.m_ui8Modifications
           << KDIS_STREAM m_ObjApr
           << KDIS_STREAM m_Loc
           << KDIS_STREAM m_Ori
           << m_ui16Length
           << m_ui16Width
           << m_ui16Height
           << m_ui16Depth
           << m_ui32Padding;
}